

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::Matchers::Detail::describe_multi_matcher
          (string *__return_storage_ptr__,Detail *this,StringRef combine,string *descriptions_begin,
          string *descriptions_end)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  string *desc;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)combine.m_size;
  for (psVar2 = psVar1; psVar2 != descriptions_begin; psVar2 = psVar2 + 1) {
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (psVar1 != descriptions_begin) {
    bVar3 = true;
    do {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(psVar1->_M_dataplus)._M_p);
      psVar1 = psVar1 + 1;
    } while (psVar1 != descriptions_begin);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string describe_multi_matcher(StringRef combine, std::string const* descriptions_begin, std::string const* descriptions_end) {
            std::string description;
            std::size_t combined_size = 4;
            for ( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                combined_size += desc->size();
            }
            combined_size += static_cast<size_t>(descriptions_end - descriptions_begin - 1) * combine.size();

            description.reserve(combined_size);

            description += "( ";
            bool first = true;
            for( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                if( first )
                    first = false;
                else
                    description += combine;
                description += *desc;
            }
            description += " )";
            return description;
        }